

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::IEEEFloat::convertFromStringSpecials(IEEEFloat *this,StringRef str)

{
  size_t sVar1;
  size_t sVar2;
  char *__s1;
  bool bVar3;
  bool bVar4;
  bool local_3b1;
  IEEEFloat *this_local;
  StringRef str_local;
  int local_12c;
  int local_10c;
  int local_ec;
  int local_cc;
  int local_ac;
  int local_8c;
  int local_6c;
  int local_4c;
  int local_2c;
  int local_c;
  
  sVar2 = str.Length;
  __s1 = str.Data;
  sVar1 = strlen("inf");
  local_3b1 = false;
  if (sVar2 == sVar1) {
    if (sVar1 == 0) {
      local_12c = 0;
    }
    else {
      local_12c = memcmp(__s1,"inf",sVar1);
    }
    local_3b1 = local_12c == 0;
  }
  bVar4 = true;
  if (!local_3b1) {
    sVar1 = strlen("INFINITY");
    bVar3 = false;
    if (sVar2 == sVar1) {
      if (sVar1 == 0) {
        local_10c = 0;
      }
      else {
        local_10c = memcmp(__s1,"INFINITY",sVar1);
      }
      bVar3 = local_10c == 0;
    }
    bVar4 = true;
    if (!bVar3) {
      sVar1 = strlen("+Inf");
      bVar4 = false;
      if (sVar2 == sVar1) {
        if (sVar1 == 0) {
          local_ec = 0;
        }
        else {
          local_ec = memcmp(__s1,"+Inf",sVar1);
        }
        bVar4 = local_ec == 0;
      }
    }
  }
  if (bVar4) {
    makeInf(this,false);
    str_local.Length._7_1_ = true;
  }
  else {
    sVar1 = strlen("-inf");
    bVar4 = false;
    if (sVar2 == sVar1) {
      if (sVar1 == 0) {
        local_cc = 0;
      }
      else {
        local_cc = memcmp(__s1,"-inf",sVar1);
      }
      bVar4 = local_cc == 0;
    }
    bVar3 = true;
    if (!bVar4) {
      sVar1 = strlen("-INFINITY");
      bVar4 = false;
      if (sVar2 == sVar1) {
        if (sVar1 == 0) {
          local_ac = 0;
        }
        else {
          local_ac = memcmp(__s1,"-INFINITY",sVar1);
        }
        bVar4 = local_ac == 0;
      }
      bVar3 = true;
      if (!bVar4) {
        sVar1 = strlen("-Inf");
        bVar3 = false;
        if (sVar2 == sVar1) {
          if (sVar1 == 0) {
            local_8c = 0;
          }
          else {
            local_8c = memcmp(__s1,"-Inf",sVar1);
          }
          bVar3 = local_8c == 0;
        }
      }
    }
    if (bVar3) {
      makeInf(this,true);
      str_local.Length._7_1_ = true;
    }
    else {
      sVar1 = strlen("nan");
      bVar4 = false;
      if (sVar2 == sVar1) {
        if (sVar1 == 0) {
          local_6c = 0;
        }
        else {
          local_6c = memcmp(__s1,"nan",sVar1);
        }
        bVar4 = local_6c == 0;
      }
      bVar3 = true;
      if (!bVar4) {
        sVar1 = strlen("NaN");
        bVar3 = false;
        if (sVar2 == sVar1) {
          if (sVar1 == 0) {
            local_4c = 0;
          }
          else {
            local_4c = memcmp(__s1,"NaN",sVar1);
          }
          bVar3 = local_4c == 0;
        }
      }
      if (bVar3) {
        makeNaN(this,false,false,(APInt *)0x0);
        str_local.Length._7_1_ = true;
      }
      else {
        sVar1 = strlen("-nan");
        bVar4 = false;
        if (sVar2 == sVar1) {
          if (sVar1 == 0) {
            local_2c = 0;
          }
          else {
            local_2c = memcmp(__s1,"-nan",sVar1);
          }
          bVar4 = local_2c == 0;
        }
        bVar3 = true;
        if (!bVar4) {
          sVar1 = strlen("-NaN");
          bVar3 = false;
          if (sVar2 == sVar1) {
            if (sVar1 == 0) {
              local_c = 0;
            }
            else {
              local_c = memcmp(__s1,"-NaN",sVar1);
            }
            bVar3 = local_c == 0;
          }
        }
        if (bVar3) {
          makeNaN(this,false,true,(APInt *)0x0);
          str_local.Length._7_1_ = true;
        }
        else {
          str_local.Length._7_1_ = false;
        }
      }
    }
  }
  return str_local.Length._7_1_;
}

Assistant:

bool IEEEFloat::convertFromStringSpecials(StringRef str) {
  if (str.equals("inf") || str.equals("INFINITY") || str.equals("+Inf")) {
    makeInf(false);
    return true;
  }

  if (str.equals("-inf") || str.equals("-INFINITY") || str.equals("-Inf")) {
    makeInf(true);
    return true;
  }

  if (str.equals("nan") || str.equals("NaN")) {
    makeNaN(false, false);
    return true;
  }

  if (str.equals("-nan") || str.equals("-NaN")) {
    makeNaN(false, true);
    return true;
  }

  return false;
}